

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void pmcr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  ulong uVar1;
  
  pmu_op_start_aarch64(env);
  if ((value & 4) != 0) {
    (env->cp15).c15_ccnt = 0;
  }
  uVar1 = (env->cp15).c9_pmcr;
  if ((uVar1 & 0xf800) != 0 && (value & 2) != 0) {
    memset((env->cp15).c14_pmevcntr,0,(ulong)((uint)(uVar1 >> 8) & 0xf8));
  }
  (env->cp15).c9_pmcr = (ulong)((uint)value & 0x79) | uVar1 & 0xffffffffffffff86;
  return;
}

Assistant:

static void pmcr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                       uint64_t value)
{
    pmu_op_start(env);

    if (value & PMCRC) {
        /* The counter has been reset */
        env->cp15.c15_ccnt = 0;
    }

    if (value & PMCRP) {
        unsigned int i;
        for (i = 0; i < pmu_num_counters(env); i++) {
            env->cp15.c14_pmevcntr[i] = 0;
        }
    }

    env->cp15.c9_pmcr &= ~PMCR_WRITEABLE_MASK;
    env->cp15.c9_pmcr |= (value & PMCR_WRITEABLE_MASK);

    pmu_op_finish(env);
}